

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O0

void __thiscall
RandomWordTestData<signed_char,_std::vector<signed_char,_std::allocator<signed_char>_>_>::
~RandomWordTestData(RandomWordTestData<signed_char,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                    *this)

{
  RandomWordTestData<signed_char,_std::vector<signed_char,_std::allocator<signed_char>_>_>
  *this_local;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->m_token_indexes);
  std::
  vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  ::~vector(&this->m_tokens);
  std::vector<signed_char,_std::allocator<signed_char>_>::~vector(&this->m_str);
  std::vector<signed_char,_std::allocator<signed_char>_>::~vector(&this->m_delim);
  return;
}

Assistant:

RandomWordTestData(T in_delim = default_delim<T>, size_t in_fixed_word_count = 0, size_t in_fixed_word_length = 0)
		: m_fixed_word_count{ in_fixed_word_count },
		m_fixed_word_length{ in_fixed_word_length } {
		m_delim.insert(m_delim.end(), in_delim);
		populate();
	}